

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

Machine * putStructure(Machine *__return_storage_ptr__,Machine *m,Register r,Functor *f)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Hix HVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  Functor local_b0;
  undefined1 local_88 [8];
  Hcell h;
  key_type local_34 [2];
  Register r_local;
  
  local_88._4_4_ = (m->h).hix + 1;
  psVar1 = &h.f_.id._M_string_length;
  h.f_.id._M_string_length._0_4_ = 0x62726167;
  h.f_.id._M_dataplus._M_p = (pointer)0x7;
  h.f_.id._M_string_length._4_4_ = 0x656761;
  h.f_.id.field_2._8_4_ = 0xffffffd6;
  local_88._0_4_ = Str;
  h._0_8_ = psVar1;
  local_34[0].r = r.r;
  pmVar5 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
  pmVar5->tag = local_88._0_4_;
  pmVar5->hix_ = (Hix)local_88._4_4_;
  std::__cxx11::string::operator=((string *)&pmVar5->f_,(string *)&h);
  (pmVar5->f_).arity = h.f_.id.field_2._8_4_;
  pmVar6 = std::
           map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
           ::operator[](&m->regval,local_34);
  HVar4.hix = (pmVar5->hix_).hix;
  pmVar6->tag = pmVar5->tag;
  pmVar6->hix_ = (Hix)HVar4.hix;
  std::__cxx11::string::_M_assign((string *)&pmVar6->f_);
  (pmVar6->f_).arity = (pmVar5->f_).arity;
  if ((size_type *)h._0_8_ != psVar1) {
    operator_delete((void *)h._0_8_,
                    CONCAT44(h.f_.id._M_string_length._4_4_,(undefined4)h.f_.id._M_string_length) +
                    1);
  }
  paVar2 = &local_b0.id.field_2;
  pcVar3 = (f->id)._M_dataplus._M_p;
  local_b0.id._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (f->id)._M_string_length);
  local_b0.arity = f->arity;
  Hcell::functor((Hcell *)local_88,&local_b0);
  h.f_._36_4_ = (m->h).hix + 1;
  pmVar5 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,(key_type *)&h.f_.field_0x24);
  pmVar5->tag = local_88._0_4_;
  pmVar5->hix_ = (Hix)local_88._4_4_;
  std::__cxx11::string::operator=((string *)&pmVar5->f_,(string *)&h);
  (pmVar5->f_).arity = h.f_.id.field_2._8_4_;
  if ((size_type *)h._0_8_ != psVar1) {
    operator_delete((void *)h._0_8_,
                    CONCAT44(h.f_.id._M_string_length._4_4_,(undefined4)h.f_.id._M_string_length) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.id._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.id._M_dataplus._M_p,local_b0.id.field_2._M_allocated_capacity + 1);
  }
  (m->h).hix = (m->h).hix + 2;
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->heap)._M_t._M_impl.super__Rb_tree_header,
             &(m->heap)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->regval)._M_t._M_impl.super__Rb_tree_header,
             &(m->regval)._M_t._M_impl.super__Rb_tree_header);
  __return_storage_ptr__->mode = m->mode;
  HVar4.hix = (m->s).hix;
  __return_storage_ptr__->h = (Hix)(m->h).hix;
  __return_storage_ptr__->s = (Hix)HVar4.hix;
  return __return_storage_ptr__;
}

Assistant:

Machine putStructure(Machine m, Register r, Functor f) {
    m.regval[r] = m.heap[m.h] = Hcell::str(m.h + 1);
    m.heap[m.h + 1] = Hcell::functor(f);
    m.h += 2;
    return m;
}